

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-input.c
# Opt level: O1

_Bool get_name_keypress(char *buf,size_t buflen,size_t *curs,size_t *len,keypress keypress,
                       _Bool firsttime)

{
  _Bool _Var1;
  size_t sVar2;
  keypress keypress_00;
  
  keypress_00._0_8_ = keypress._0_8_;
  if (keypress.code == 0x2a) {
    sVar2 = player_random_name(buf,buflen);
    *len = sVar2;
    *curs = 0;
    return false;
  }
  keypress_00._8_4_ = keypress._8_4_ & 0xff;
  _Var1 = askfor_aux_keypress(buf,buflen,curs,len,keypress_00,firsttime);
  return _Var1;
}

Assistant:

static bool get_name_keypress(char *buf, size_t buflen, size_t *curs,
							  size_t *len, struct keypress keypress,
							  bool firsttime)
{
	bool result;

	switch (keypress.code)
	{
		case '*':
		{
			*len = player_random_name(buf, buflen);
			*curs = 0;
			result = false;
			break;
		}

		default:
		{
			result = askfor_aux_keypress(buf, buflen, curs, len, keypress,
										 firsttime);
			break;
		}
	}

	return result;
}